

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChHexahedronFace::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChHexahedronFace *this,double U,double V)

{
  double dVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  int i;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChVector<double> result;
  
  i = (int)this;
  GetNodeN((ChHexahedronFace *)&result,i);
  dVar1 = *(double *)((long)result.m_data[0] + 0x20);
  dVar8 = *(double *)*(undefined1 (*) [16])((long)result.m_data[0] + 0x28);
  auVar5 = *(undefined1 (*) [16])((long)result.m_data[0] + 0x28);
  uVar2 = *(undefined8 *)((long)result.m_data[0] + 0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_data + 1));
  GetNodeN((ChHexahedronFace *)&result,i);
  dVar3 = *(double *)((long)result.m_data[0] + 0x20);
  auVar6 = *(undefined1 (*) [16])((long)result.m_data[0] + 0x28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_data + 1));
  GetNodeN((ChHexahedronFace *)&result,i);
  dVar4 = *(double *)((long)result.m_data[0] + 0x28);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)((long)result.m_data[0] + 0x30);
  auVar9 = vmovhps_avx(auVar9,*(undefined8 *)((long)result.m_data[0] + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_data + 1));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar5 = vsubpd_avx(auVar6,auVar5);
  auVar6._8_8_ = uVar2;
  auVar6._0_8_ = uVar2;
  auVar6 = vunpcklpd_avx(auVar6,auVar7);
  auVar6 = vsubpd_avx(auVar9,auVar6);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3 - dVar1;
  auVar9 = vshufpd_avx(auVar5,auVar10,1);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 - dVar8;
  auVar7 = vunpcklpd_avx(auVar12,auVar6);
  auVar13._0_8_ = auVar7._0_8_ * auVar9._0_8_;
  auVar13._8_8_ = auVar7._8_8_ * auVar9._8_8_;
  result.m_data._0_16_ = vfmsub231pd_fma(auVar13,auVar5,auVar6);
  auVar9 = vshufpd_avx(auVar6,auVar6,1);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar9._0_8_ * auVar5._0_8_;
  auVar9 = vfmsub231sd_fma(auVar11,auVar10,auVar12);
  result.m_data[2] = auVar9._0_8_;
  ChVector<double>::GetNormalized(__return_storage_ptr__,&result);
  return __return_storage_ptr__;
}

Assistant:

virtual ChVector<> ComputeNormal(const double U, const double V) override {
        ChVector<> p0 = GetNodeN(0)->GetPos();
        ChVector<> p1 = GetNodeN(1)->GetPos();
        ChVector<> p2 = GetNodeN(2)->GetPos();
        return Vcross(p1 - p0, p2 - p0).GetNormalized();
    }